

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

GroupSizes __thiscall QLocaleData::groupSizes(QLocaleData *this)

{
  uint uVar1;
  GroupSizes GVar2;
  
  uVar1 = *(uint *)&this->field_0x78;
  GVar2.least = uVar1 >> 0x13 & 7;
  GVar2._0_8_ = CONCAT44(uVar1 >> 0x10,uVar1 >> 0xe) & 0x700000003;
  return GVar2;
}

Assistant:

QLocaleData::GroupSizes QLocaleData::groupSizes() const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (this == &systemLocaleData) {
        QVariant queryResult = systemLocale()->query(QSystemLocale::Grouping);
        if (!queryResult.isNull()) {
            QLocaleData::GroupSizes sysGroupSizes =
                    queryResult.value<QLocaleData::GroupSizes>();
            if (sysGroupSizes.first <= 0)
                sysGroupSizes.first = m_grouping_first;
            if (sysGroupSizes.higher <= 0)
                sysGroupSizes.higher = m_grouping_higher;
            if (sysGroupSizes.least <= 0)
                sysGroupSizes.least = m_grouping_least;
            return sysGroupSizes;
        }
    }
#endif
    return { m_grouping_first,
             m_grouping_higher,
             m_grouping_least };
}